

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnp.cpp
# Opt level: O1

double __thiscall libtorrent::upnp::log(upnp *this,double __x)

{
  char in_AL;
  int iVar1;
  char *in_RSI;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar2;
  va_list v;
  char msg [1024];
  undefined8 local_4e8;
  void **local_4e0;
  undefined1 *local_4d8;
  undefined1 local_4c8 [48];
  double local_498;
  char local_418 [1024];
  
  if (in_AL != '\0') {
    local_498 = __x;
  }
  iVar1 = (*this->m_callback->_vptr_portmap_callback[1])(this->m_callback,1);
  dVar2 = extraout_XMM0_Qa;
  if ((char)iVar1 != '\0') {
    local_4d8 = local_4c8;
    local_4e0 = &v[0].overflow_arg_area;
    local_4e8 = 0x3000000010;
    vsnprintf(local_418,0x400,in_RSI,&local_4e8);
    (*this->m_callback->_vptr_portmap_callback[2])
              (this->m_callback,1,local_418,&this->m_listen_handle);
    dVar2 = extraout_XMM0_Qa_00;
  }
  return dVar2;
}

Assistant:

void upnp::log(char const* fmt, ...) const
{
	TORRENT_ASSERT(is_single_thread());
	if (!should_log()) return;
	va_list v;
	va_start(v, fmt);
	char msg[1024];
	std::vsnprintf(msg, sizeof(msg), fmt, v);
	va_end(v);
	m_callback.log_portmap(portmap_transport::upnp, msg, m_listen_handle);
}